

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

int run_test_tcp_close_reset_accepted(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_tcp_t *in_RSI;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(loop,in_RSI);
  eval_a = (int64_t)write_cb_called;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)close_cb_called;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = (int64_t)shutdown_cb_called;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_run(loop,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 4;
          eval_b = (int64_t)write_cb_called;
          if (eval_b == 4) {
            eval_a = 1;
            eval_b = (int64_t)close_cb_called;
            if (eval_b == 1) {
              eval_a = (int64_t)shutdown_cb_called;
              eval_b = 0;
              if (eval_a == 0) {
                close_loop(loop);
                eval_a = 0;
                iVar1 = uv_loop_close(loop);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(loop)";
                pcVar3 = "0";
                uVar2 = 0x11b;
              }
              else {
                pcVar4 = "0";
                pcVar3 = "shutdown_cb_called";
                uVar2 = 0x119;
              }
            }
            else {
              pcVar4 = "close_cb_called";
              pcVar3 = "1";
              uVar2 = 0x118;
            }
          }
          else {
            pcVar4 = "write_cb_called";
            pcVar3 = "4";
            uVar2 = 0x117;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x115;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "shutdown_cb_called";
        uVar2 = 0x112;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "close_cb_called";
      uVar2 = 0x111;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "write_cb_called";
    uVar2 = 0x110;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}